

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_movep(DisasContext_conflict6 *ctx,int enc_dest,int enc_rt,int enc_rs)

{
  int iVar1;
  int iVar2;
  long lVar3;
  TCGArg TVar4;
  TCGOpcode TVar5;
  
  iVar1 = gen_movep::re_enc[(uint)enc_dest];
  iVar2 = gen_movep::rs_rt_enc[(uint)enc_rt];
  if (enc_rs == 0) {
    lVar3 = *(long *)(&ctx[0xf9].gi + (long)gen_movep::rd_enc[(uint)enc_dest] * 2);
    TVar5 = INDEX_op_movi_i64;
    TVar4 = 0;
  }
  else {
    lVar3 = *(long *)(&ctx[0xf9].gi + (long)gen_movep::rd_enc[(uint)enc_dest] * 2);
    if (lVar3 == *(long *)(&ctx[0xf9].gi + (long)gen_movep::rs_rt_enc[(uint)enc_rs] * 2))
    goto LAB_009ae3a8;
    TVar4 = (long)&(ctx->base).tb +
            *(long *)(&ctx[0xf9].gi + (long)gen_movep::rs_rt_enc[(uint)enc_rs] * 2);
    TVar5 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar5,(long)&(ctx->base).tb + lVar3,TVar4);
LAB_009ae3a8:
  if (enc_rt == 0) {
    TVar5 = INDEX_op_movi_i64;
    TVar4 = 0;
  }
  else {
    if (*(long *)(&ctx[0xf9].gi + (long)iVar1 * 2) == *(long *)(&ctx[0xf9].gi + (long)iVar2 * 2)) {
      return;
    }
    TVar4 = (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)iVar2 * 2);
    TVar5 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el
            ((TCGContext_conflict6 *)ctx,TVar5,
             (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)iVar1 * 2),TVar4);
  return;
}

Assistant:

static inline void gen_movep(DisasContext *ctx, int enc_dest, int enc_rt,
                             int enc_rs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd, rs, re, rt;
    static const int rd_enc[] = { 5, 5, 6, 4, 4, 4, 4, 4 };
    static const int re_enc[] = { 6, 7, 7, 21, 22, 5, 6, 7 };
    static const int rs_rt_enc[] = { 0, 17, 2, 3, 16, 18, 19, 20 };
    rd = rd_enc[enc_dest];
    re = re_enc[enc_dest];
    rs = rs_rt_enc[enc_rs];
    rt = rs_rt_enc[enc_rt];
    if (rs) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
    }
    if (rt) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[re], tcg_ctx->cpu_gpr[rt]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[re], 0);
    }
}